

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int *piVar1;
  char *pcVar2;
  byte *ptr;
  int64_t sz;
  byte *data;
  stat st;
  int err;
  int fd;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    st.__glibc_reserved[2]._0_4_ = stat(argv[1],(stat *)&data);
    if ((int)st.__glibc_reserved[2] == -1) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      printf("stat failed with: %s\n",pcVar2);
    }
    else {
      st.__glibc_reserved[2]._4_4_ = open(argv[1],0);
      if (st.__glibc_reserved[2]._4_4_ == -1) {
        piVar1 = __errno_location();
        pcVar2 = strerror(*piVar1);
        printf("open failed with: %s\n",pcVar2);
      }
      else {
        printf("file size: %zd\n",st.st_rdev);
        ptr = (byte *)mmap((void *)0x0,st.st_rdev,1,2,st.__glibc_reserved[2]._4_4_,0);
        if (ptr == (byte *)0xffffffffffffffff) {
          piVar1 = __errno_location();
          pcVar2 = strerror(*piVar1);
          printf("mmap failed with: %s\n",pcVar2);
        }
        else {
          extract(ptr,st.st_rdev);
          st.__glibc_reserved[2]._0_4_ = munmap(ptr,st.st_rdev);
          if ((int)st.__glibc_reserved[2] == 0) {
            close(st.__glibc_reserved[2]._4_4_);
          }
          else {
            piVar1 = __errno_location();
            pcVar2 = strerror(*piVar1);
            printf("munmap failed with: %s\n",pcVar2);
          }
        }
      }
    }
  }
  else {
    printf("usage: llvmbc-dump <ifile>\n");
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int fd, err;
    struct stat st;
    byte *data;
    int64_t sz;

    if (argc != 2) {
        printf("usage: llvmbc-dump <ifile>\n");
        return 0;
    }

    err = stat(argv[1], &st);
    if (err == -1) {
        printf("stat failed with: %s\n", strerror(errno));
        return 0;
    }

    fd = open(argv[1], O_RDONLY);
    if (fd == -1) {
        printf("open failed with: %s\n", strerror(errno));
        return 0;
    }

    sz = st.st_size;
    printf("file size: %zd\n", st.st_size);

    data = (byte *) mmap(NULL, st.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
    if (data == MAP_FAILED) {
        printf("mmap failed with: %s\n", strerror(errno));
        return 0;
    }

    if (0) {
        dump(data, 0, st.st_size, 8, (char *) "\t");
    }

    extract(data, st.st_size);

    err = munmap(data, st.st_size);
    if (err != 0) {
        printf("munmap failed with: %s\n", strerror(errno));
        return 0;
    }

    close(fd);
    return 0;
}